

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

UGroup * duckdb_re2::MaybeParsePerlCCEscape(StringPiece *s,ParseFlags parse_flags)

{
  UGroup *pUVar1;
  StringPiece name;
  StringPiece local_18;
  
  if (-1 < (char)parse_flags) {
    return (UGroup *)0x0;
  }
  if ((s->size_ < 2) || (local_18.data_ = s->data_, *local_18.data_ != '\\')) {
    pUVar1 = (UGroup *)0x0;
  }
  else {
    local_18.size_ = 2;
    pUVar1 = LookupGroup(&local_18,(UGroup *)perl_groups,6);
    if (pUVar1 != (UGroup *)0x0) {
      s->data_ = s->data_ + local_18.size_;
      s->size_ = s->size_ - local_18.size_;
    }
  }
  return pUVar1;
}

Assistant:

const UGroup* MaybeParsePerlCCEscape(StringPiece* s, Regexp::ParseFlags parse_flags) {
  if (!(parse_flags & Regexp::PerlClasses))
    return NULL;
  if (s->size() < 2 || (*s)[0] != '\\')
    return NULL;
  // Could use StringPieceToRune, but there aren't
  // any non-ASCII Perl group names.
  StringPiece name(s->data(), 2);
  const UGroup *g = LookupPerlGroup(name);
  if (g == NULL)
    return NULL;
  s->remove_prefix(name.size());
  return g;
}